

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O1

void end_pass(bfgs *b)

{
  ulong uVar1;
  vw *all;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  string local_68;
  string local_48;
  
  uVar1 = b->current_pass;
  if (uVar1 <= b->final_pass) {
    if (uVar1 < b->final_pass) {
      all = b->all;
      iVar4 = process_pass(all,b);
      if (b->final_pass == b->current_pass) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (&(b->all->trace_message).super_ostream,"Maximum number of passes reached. ",0x22)
        ;
        if (b->output_regularizer == false) {
          std::__ostream_insert<char,std::char_traits<char>>
                    (&(b->all->trace_message).super_ostream,
                     "If you want to optimize further, increase the number of passes\n",0x3f);
        }
        if (b->output_regularizer == true) {
          std::__ostream_insert<char,std::char_traits<char>>
                    (&(b->all->trace_message).super_ostream,
                     "\nRegular model file has been created. ",0x26);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&(b->all->trace_message).super_ostream,
                     "Output feature regularizer file is created only when the convergence is reached. Try increasing the number of passes for convergence\n"
                     ,0x85);
          b->output_regularizer = false;
        }
      }
      if ((iVar4 == 0) || (b->final_pass <= b->current_pass)) {
        zero_preconditioner(all);
      }
      else {
        b->final_pass = b->current_pass;
      }
      if (all->holdout_set_off == false) {
        bVar3 = summarize_holdout_set(all,&b->no_win_counter);
        if (bVar3) {
          pcVar2 = (all->final_regressor_name)._M_dataplus._M_p;
          local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_48,pcVar2,
                     pcVar2 + (all->final_regressor_name)._M_string_length);
          finalize_regressor(all,&local_48);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_48._M_dataplus._M_p != &local_48.field_2) {
            operator_delete(local_48._M_dataplus._M_p);
          }
        }
        if (b->early_stop_thres == b->no_win_counter) {
          set_done(all);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&(b->all->trace_message).super_ostream,
                     "Early termination reached w.r.t. holdout set error",0x32);
        }
      }
      if (b->final_pass == b->current_pass) {
        pcVar2 = (all->final_regressor_name)._M_dataplus._M_p;
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_68,pcVar2,pcVar2 + (all->final_regressor_name)._M_string_length)
        ;
        finalize_regressor(all,&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p);
        }
        set_done(all);
      }
    }
    else {
      b->current_pass = uVar1 + 1;
    }
  }
  return;
}

Assistant:

void end_pass(bfgs& b)
{
  vw* all = b.all;

  if (b.current_pass <= b.final_pass)
  {
    if (b.current_pass < b.final_pass)
    {
      int status = process_pass(*all, b);

      // reaching the max number of passes regardless of convergence
      if (b.final_pass == b.current_pass)
      {
        b.all->trace_message << "Maximum number of passes reached. ";
        if (!b.output_regularizer)
          b.all->trace_message << "If you want to optimize further, increase the number of passes\n";
        if (b.output_regularizer)
        {
          b.all->trace_message << "\nRegular model file has been created. ";
          b.all->trace_message << "Output feature regularizer file is created only when the convergence is reached. "
                                  "Try increasing the number of passes for convergence\n";
          b.output_regularizer = false;
        }
      }

      // attain convergence before reaching max iterations
      if (status != LEARN_OK && b.final_pass > b.current_pass)
      {
        b.final_pass = b.current_pass;
      }
      else
      {
        // Not converged yet.
        // Reset preconditioner to zero so that it is correctly recomputed in the next pass
        zero_preconditioner(*all);
      }
      if (!all->holdout_set_off)
      {
        if (summarize_holdout_set(*all, b.no_win_counter))
          finalize_regressor(*all, all->final_regressor_name);
        if (b.early_stop_thres == b.no_win_counter)
        {
          set_done(*all);
          b.all->trace_message << "Early termination reached w.r.t. holdout set error";
        }
      }
      if (b.final_pass == b.current_pass)
      {
        finalize_regressor(*all, all->final_regressor_name);
        set_done(*all);
      }
    }
    else  // reaching convergence in the previous pass
      b.current_pass++;
  }
}